

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall
cppcms::application::add(application *this,application *app,string *name,string *url)

{
  ulong in_R8;
  void *in_R9;
  
  add(this,app);
  url_mapper::mount((((this->d).ptr_)->url_map).ptr_,(char *)name,(char *)url,(char *)app,in_R8,
                    in_R9);
  return;
}

Assistant:

void application::add(application &app,std::string const &name,std::string const &url)
{
	add(app);
	mapper().mount(name,url,app);
}